

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FFont::FixXMoves(FFont *this)

{
  bool bVar1;
  int iVar2;
  int noaccent;
  int upper;
  int i;
  FFont *this_local;
  
  for (noaccent = 0; noaccent <= this->LastChar - this->FirstChar; noaccent = noaccent + 1) {
    if (this->Chars[noaccent].XMove == -0x80000000) {
      bVar1 = myislower(noaccent + this->FirstChar);
      if ((bVar1) && (-1 < noaccent + -0x20)) {
        this->Chars[noaccent].XMove = this->Chars[noaccent + -0x20].XMove;
      }
      else {
        iVar2 = stripaccent(noaccent + this->FirstChar);
        if ((iVar2 == noaccent + this->FirstChar) || (iVar2 = iVar2 - this->FirstChar, iVar2 < 0)) {
          this->Chars[noaccent].XMove = this->SpaceWidth;
        }
        else {
          this->Chars[noaccent].XMove = this->Chars[iVar2].XMove;
        }
      }
    }
  }
  return;
}

Assistant:

void FFont::FixXMoves()
{
	for (int i = 0; i <= LastChar - FirstChar; ++i)
	{
		if (Chars[i].XMove == INT_MIN)
		{
			// Try an uppercase character.
			if (myislower(i + FirstChar))
			{
				int upper = i - 32;
				if (upper >= 0)
				{
					Chars[i].XMove = Chars[upper].XMove;
					continue;
				}
			}
			// Try an unnaccented character.
			int noaccent = stripaccent(i + FirstChar);
			if (noaccent != i + FirstChar)
			{
				noaccent -= FirstChar;
				if (noaccent >= 0)
				{
					Chars[i].XMove = Chars[noaccent].XMove;
					continue;
				}
			}
			Chars[i].XMove = SpaceWidth;
		}
	}
}